

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_default_xml_generator.hpp
# Opt level: O0

void __thiscall
iutest::DefaultXmlGeneratorListener::DefaultXmlGeneratorListener
          (DefaultXmlGeneratorListener *this,string *path)

{
  string *path_local;
  DefaultXmlGeneratorListener *this_local;
  
  EmptyTestEventListener::EmptyTestEventListener(&this->super_EmptyTestEventListener);
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__DefaultXmlGeneratorListener_0016e030;
  std::__cxx11::string::string((string *)&this->m_output_path_format);
  std::__cxx11::string::string((string *)&this->m_output_path);
  this->m_fp = (IFile *)0x0;
  SetFilePath(this,path);
  return;
}

Assistant:

explicit DefaultXmlGeneratorListener(const ::std::string& path)
        : m_fp(NULL)
    {
        SetFilePath(path);
    }